

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O0

uint32_t *
createDFD422(int bigEndian,int numSamples,int *bits,int *shiftBits,int *channels,int *position_xs,
            int *position_ys,VkSuffix suffix)

{
  int iVar1;
  uint uVar2;
  uint *__s;
  uint *puVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int i_1;
  int bitOffset;
  uint32_t *BDFD;
  uint32_t *DFD;
  uint32_t DFDSize;
  uint32_t BDFDSize;
  int i;
  int totalBits;
  int local_50;
  int local_4c;
  int local_30;
  int local_2c;
  
  if (in_EDI != 0) {
    __assert_fail("!bigEndian",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x194,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  if ((int)BDFD == 0) {
    local_2c = 0;
    for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
      local_2c = *(int *)(in_RCX + (long)local_30 * 4) + *(int *)(in_RDX + (long)local_30 * 4) +
                 local_2c;
    }
    if (local_2c % 8 == 0) {
      iVar1 = in_ESI * 4 + 6;
      uVar2 = iVar1 * 4 + 4;
      __s = (uint *)malloc((ulong)uVar2);
      memset(__s,0,(ulong)uVar2);
      *__s = uVar2;
      puVar3 = __s + 1;
      *puVar3 = *puVar3 & 0xfffe0000;
      *puVar3 = *puVar3 & 0x1ffff;
      __s[2] = __s[2] & 0xffff0000 | 2;
      __s[2] = __s[2] & 0xffff | iVar1 * 0x40000;
      __s[3] = __s[3] & 0xffffff00 | 2;
      __s[3] = __s[3] & 0xffff00ff;
      __s[3] = __s[3] & 0xff00ffff | 0x10000;
      __s[3] = __s[3] & 0xffffff;
      __s[4] = __s[4] & 0xffffff00 | 1;
      __s[4] = __s[4] & 0xffff00ff;
      __s[4] = __s[4] & 0xff00ffff;
      __s[4] = __s[4] & 0xffffff;
      __s[5] = __s[5] & 0xffffff00 | local_2c / 8 & 0xffU;
      __s[5] = __s[5] & 0xffff00ff;
      __s[5] = __s[5] & 0xff00ffff;
      __s[5] = __s[5] & 0xffffff;
      __s[6] = __s[6] & 0xffffff00;
      __s[6] = __s[6] & 0xffff00ff;
      __s[6] = __s[6] & 0xff00ffff;
      __s[6] = __s[6] & 0xffffff;
      local_4c = 0;
      for (local_50 = 0; local_50 < in_ESI; local_50 = local_50 + 1) {
        uVar2 = *(int *)(in_RCX + (long)local_50 * 4) + local_4c;
        puVar3[local_50 * 4 + 6] = puVar3[local_50 * 4 + 6] & 0xffff0000 | uVar2 & 0xffff;
        puVar3[local_50 * 4 + 6] =
             puVar3[local_50 * 4 + 6] & 0xff00ffff |
             (*(int *)(in_RDX + (long)local_50 * 4) - 1U & 0xff) << 0x10;
        puVar3[local_50 * 4 + 6] =
             puVar3[local_50 * 4 + 6] & 0xf0ffffff |
             (*(uint *)(in_R8 + (long)local_50 * 4) & 0xf) << 0x18;
        puVar3[local_50 * 4 + 6] = puVar3[local_50 * 4 + 6] & 0xfffffff;
        puVar3[local_50 * 4 + 7] =
             puVar3[local_50 * 4 + 7] & 0xffffff00 | *(uint *)(in_R9 + (long)local_50 * 4) & 0xff;
        puVar3[local_50 * 4 + 7] =
             puVar3[local_50 * 4 + 7] & 0xffff00ff |
             (*(uint *)(_i_1 + (long)local_50 * 4) & 0xff) << 8;
        puVar3[local_50 * 4 + 7] = puVar3[local_50 * 4 + 7] & 0xff00ffff;
        puVar3[local_50 * 4 + 7] = puVar3[local_50 * 4 + 7] & 0xffffff;
        puVar3[local_50 * 4 + 8] = 0;
        puVar3[local_50 * 4 + 9] =
             (1 << ((byte)*(undefined4 *)(in_RDX + (long)local_50 * 4) & 0x1f)) - 1;
        local_4c = *(int *)(in_RDX + (long)local_50 * 4) + uVar2;
      }
      return __s;
    }
    __assert_fail("totalBits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x19a,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  __assert_fail("suffix == s_UNORM",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                ,0x195,
                "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
               );
}

Assistant:

uint32_t *createDFD422(int bigEndian, int numSamples,
                       int bits[], int shiftBits[], int channels[],
                       int position_xs[], int position_ys[],
                       enum VkSuffix suffix) {
    assert(!bigEndian); (void) bigEndian;
    assert(suffix == s_UNORM); (void) suffix;

    int totalBits = 0;
    for (int i = 0; i < numSamples; ++i)
        totalBits += shiftBits[i] + bits[i];
    assert(totalBits % 8 == 0);

    uint32_t BDFDSize = sizeof(uint32_t) * (KHR_DF_WORD_SAMPLESTART + numSamples * KHR_DF_WORD_SAMPLEWORDS);
    uint32_t DFDSize = sizeof(uint32_t) + BDFDSize;
    uint32_t *DFD = (uint32_t *) malloc(DFDSize);
    memset(DFD, 0, DFDSize);
    DFD[0] = DFDSize;
    uint32_t *BDFD = DFD + 1;
    KHR_DFDSETVAL(BDFD, VENDORID, KHR_DF_VENDORID_KHRONOS);
    KHR_DFDSETVAL(BDFD, DESCRIPTORTYPE, KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT);
    KHR_DFDSETVAL(BDFD, VERSIONNUMBER, KHR_DF_VERSIONNUMBER_LATEST);
    KHR_DFDSETVAL(BDFD, DESCRIPTORBLOCKSIZE, BDFDSize);
    KHR_DFDSETVAL(BDFD, MODEL, KHR_DF_MODEL_YUVSDA);
    KHR_DFDSETVAL(BDFD, PRIMARIES, KHR_DF_PRIMARIES_UNSPECIFIED);
    KHR_DFDSETVAL(BDFD, TRANSFER, KHR_DF_TRANSFER_LINEAR);
    KHR_DFDSETVAL(BDFD, FLAGS, KHR_DF_FLAG_ALPHA_STRAIGHT);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION0, 2 - 1); // 422 contains 2 x 1 blocks
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION1, 1 - 1);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION2, 1 - 1);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION3, 1 - 1);
    KHR_DFDSETVAL(BDFD, BYTESPLANE0, totalBits / 8);
    KHR_DFDSETVAL(BDFD, BYTESPLANE1, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE2, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE3, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE4, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE5, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE6, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE7, 0);

    int bitOffset = 0;
    for (int i = 0; i < numSamples; ++i) {
        bitOffset += shiftBits[i];
        KHR_DFDSETSVAL(BDFD, i, BITOFFSET, bitOffset);
        KHR_DFDSETSVAL(BDFD, i, BITLENGTH, bits[i] - 1);
        KHR_DFDSETSVAL(BDFD, i, CHANNELID, channels[i]);
        KHR_DFDSETSVAL(BDFD, i, QUALIFIERS, 0); // None of: FLOAT, SIGNED, EXPONENT, LINEAR
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION0, position_xs[i]);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION1, position_ys[i]);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION2, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION3, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLELOWER, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEUPPER, (1u << bits[i]) - 1u);
        bitOffset += bits[i];
    }

    return DFD;
}